

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_operationset.c
# Opt level: O0

void FAudio_OPERATIONSET_Commit(FAudio *audio,uint32_t OperationSet)

{
  long lVar1;
  int in_ESI;
  long in_RDI;
  FAudio_OPERATIONSET_Operation **committed_end;
  FAudio_OPERATIONSET_Operation *prev;
  FAudio_OPERATIONSET_Operation *next;
  FAudio_OPERATIONSET_Operation *op;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_18;
  
  FAudio_PlatformLockMutex((FAudioMutex)0x134b6b);
  if (*(long *)(in_RDI + 0x78) == 0) {
    FAudio_PlatformUnlockMutex((FAudioMutex)0x134b85);
  }
  else {
    for (local_30 = (long *)(in_RDI + 0x80); *local_30 != 0; local_30 = (long *)(*local_30 + 0x28))
    {
    }
    local_28 = 0;
    local_18 = *(long *)(in_RDI + 0x78);
    do {
      lVar1 = *(long *)(local_18 + 0x28);
      if (*(int *)(local_18 + 4) == in_ESI) {
        if (local_28 == 0) {
          *(long *)(in_RDI + 0x78) = lVar1;
        }
        else {
          *(long *)(local_28 + 0x28) = lVar1;
        }
        *local_30 = local_18;
        *(undefined8 *)(local_18 + 0x28) = 0;
        local_30 = (long *)(local_18 + 0x28);
      }
      else {
        local_28 = local_18;
      }
      local_18 = lVar1;
    } while (lVar1 != 0);
    FAudio_PlatformUnlockMutex((FAudioMutex)0x134c69);
  }
  return;
}

Assistant:

void FAudio_OPERATIONSET_Commit(FAudio *audio, uint32_t OperationSet)
{
	FAudio_OPERATIONSET_Operation *op, *next, *prev, **committed_end;

	FAudio_PlatformLockMutex(audio->operationLock);
	LOG_MUTEX_LOCK(audio, audio->operationLock)

	if (audio->queuedOperations == NULL)
	{
		FAudio_PlatformUnlockMutex(audio->operationLock);
		LOG_MUTEX_UNLOCK(audio, audio->operationLock)
		return;
	}

	committed_end = &audio->committedOperations;
	while (*committed_end)
	{
		committed_end = &((*committed_end)->next);
	}

	op = audio->queuedOperations;
	prev = NULL;
	do
	{
		next = op->next;
		if (op->OperationSet == OperationSet)
		{
			if (prev == NULL) /* Start of linked list */
			{
				audio->queuedOperations = next;
			}
			else
			{
				prev->next = next;
			}

			*committed_end = op;
			op->next = NULL;
			committed_end = &op->next;
		}
		else
		{
			prev = op;
		}
		op = next;
	} while (op != NULL);

	FAudio_PlatformUnlockMutex(audio->operationLock);
	LOG_MUTEX_UNLOCK(audio, audio->operationLock)
}